

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Leave(Map *this,Character *character,WarpAnimation animation,bool silent)

{
  Character *other;
  bool bVar1;
  int num;
  _List_iterator<Character_*> __first;
  undefined7 in_register_00000009;
  list<Character_*,_std::allocator<Character_*>_> *__last;
  _List_node_base *p_Var2;
  Character *character_local;
  PacketBuilder builder;
  
  character_local = character;
  if ((int)CONCAT71(in_register_00000009,silent) == 0) {
    PacketBuilder::PacketBuilder(&builder,PACKET_AVATAR,PACKET_REMOVE,3);
    num = Character::PlayerID(character);
    PacketBuilder::AddShort(&builder,num);
    if (animation != WARP_ANIMATION_NONE) {
      PacketBuilder::AddChar(&builder,(uint)animation);
    }
    p_Var2 = (_List_node_base *)&this->characters;
    while (p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->characters) {
      other = (Character *)p_Var2[1]._M_next;
      if (other != character) {
        bVar1 = Character::InRange(character,other);
        if (bVar1) {
          Character::Send(other,&builder);
        }
      }
    }
    PacketBuilder::~PacketBuilder(&builder);
  }
  __last = &this->characters;
  __first = std::
            __remove_if<std::_List_iterator<Character*>,__gnu_cxx::__ops::_Iter_equals_val<Character*const>>
                      ((this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next,(_List_iterator<Character_*>)__last,
                       (_Iter_equals_val<Character_*const>)&character_local);
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::erase
            (__last,(const_iterator)__first._M_node,(const_iterator)__last);
  character_local->map = (Map *)0x0;
  return;
}

Assistant:

void Map::Leave(Character *character, WarpAnimation animation, bool silent)
{
	if (!silent)
	{
		PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 3);
		builder.AddShort(character->PlayerID());

		if (animation != WARP_ANIMATION_NONE)
		{
			builder.AddChar(animation);
		}

		UTIL_FOREACH(this->characters, checkcharacter)
		{
			if (checkcharacter == character || !character->InRange(checkcharacter))
			{
				continue;
			}

			checkcharacter->Send(builder);
		}
	}

	this->characters.erase(
		std::remove(UTIL_RANGE(this->characters), character),
		this->characters.end()
	);

	character->map = 0;
}